

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_palette.cpp
# Opt level: O0

ComparisonResult __thiscall ProtoPalette::compare(ProtoPalette *this,ProtoPalette *other)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  ComparisonResult local_74;
  bool theyBigger;
  const_iterator pvStack_28;
  bool weBigger;
  const_iterator theirs;
  const_iterator ours;
  ProtoPalette *other_local;
  ProtoPalette *this_local;
  
  pvVar4 = std::array<unsigned_short,_4UL>::begin(&this->_colorIndices);
  pvVar5 = std::array<unsigned_short,_4UL>::end(&this->_colorIndices);
  bVar3 = std::is_sorted<unsigned_short_const*>(pvVar4,pvVar5);
  if (!bVar3) {
    __assert_fail("std::is_sorted(_colorIndices.begin(), _colorIndices.end())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/proto_palette.cpp"
                  ,0x2d,
                  "ProtoPalette::ComparisonResult ProtoPalette::compare(const ProtoPalette &) const"
                 );
  }
  pvVar4 = std::array<unsigned_short,_4UL>::begin(&other->_colorIndices);
  pvVar5 = std::array<unsigned_short,_4UL>::end(&other->_colorIndices);
  bVar3 = std::is_sorted<unsigned_short_const*>(pvVar4,pvVar5);
  if (!bVar3) {
    __assert_fail("std::is_sorted(other._colorIndices.begin(), other._colorIndices.end())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/proto_palette.cpp"
                  ,0x2e,
                  "ProtoPalette::ComparisonResult ProtoPalette::compare(const ProtoPalette &) const"
                 );
  }
  theirs = std::array<unsigned_short,_4UL>::begin(&this->_colorIndices);
  pvStack_28 = std::array<unsigned_short,_4UL>::begin(&other->_colorIndices);
  bVar2 = 1;
  bVar1 = 1;
  while( true ) {
    pvVar4 = std::array<unsigned_short,_4UL>::end(&this->_colorIndices);
    bVar3 = false;
    if (theirs != pvVar4) {
      pvVar4 = std::array<unsigned_short,_4UL>::end(&other->_colorIndices);
      bVar3 = pvStack_28 != pvVar4;
    }
    if (!bVar3) break;
    if (*theirs == *pvStack_28) {
      theirs = theirs + 1;
      pvStack_28 = pvStack_28 + 1;
    }
    else if (*theirs < *pvStack_28) {
      theirs = theirs + 1;
      bVar1 = 0;
    }
    else {
      pvStack_28 = pvStack_28 + 1;
      bVar2 = 0;
    }
  }
  pvVar4 = std::array<unsigned_short,_4UL>::end(&other->_colorIndices);
  pvVar5 = std::array<unsigned_short,_4UL>::end(&this->_colorIndices);
  if ((bool)(bVar1 & theirs == pvVar5)) {
    local_74 = THEY_BIGGER;
  }
  else {
    local_74 = (ComparisonResult)(bVar2 & pvStack_28 == pvVar4);
  }
  return local_74;
}

Assistant:

ProtoPalette::ComparisonResult ProtoPalette::compare(ProtoPalette const &other) const {
	// This works because the sets are sorted numerically
	assert(std::is_sorted(_colorIndices.begin(), _colorIndices.end()));
	assert(std::is_sorted(other._colorIndices.begin(), other._colorIndices.end()));

	auto ours = _colorIndices.begin(), theirs = other._colorIndices.begin();
	bool weBigger = true, theyBigger = true;

	while (ours != _colorIndices.end() && theirs != other._colorIndices.end()) {
		if (*ours == *theirs) {
			++ours;
			++theirs;
		} else if (*ours < *theirs) {
			++ours;
			theyBigger = false;
		} else { // *ours > *theirs
			++theirs;
			weBigger = false;
		}
	}
	weBigger &= theirs == other._colorIndices.end();
	theyBigger &= ours == _colorIndices.end();

	return theyBigger ? THEY_BIGGER : (weBigger ? WE_BIGGER : NEITHER);
}